

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

optional<PSEngine::TurnHistory> * __thiscall
PSEngine::receive_input
          (optional<PSEngine::TurnHistory> *__return_storage_ptr__,PSEngine *this,InputType p_input)

{
  element_type *peVar1;
  char cVar2;
  pointer pCVar3;
  _Rb_tree_node_base *p_Var4;
  undefined1 local_170 [16];
  string local_160 [32];
  PSEngine *local_140;
  optional<PSEngine::TurnHistory> *local_138;
  pointer local_130;
  pointer local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [32];
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
  local_60;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"",(allocator<char> *)&local_120);
  Operation::Operation((Operation *)local_170,Input,p_input,-1,&local_80);
  std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::
  emplace_back<PSEngine::Operation>(&this->m_operation_history,(Operation *)local_170);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string((string *)&local_80);
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar1 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string(local_a0,(string *)&m_engine_log_cat_abi_cxx11_);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
    ::_Rb_tree(&local_60,&to_input_type_abi_cxx11_._M_t);
    enum_to_str<PSEngine::InputType>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_170,p_input,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
                *)&local_60);
    std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
              (&local_120,(optional<std::__cxx11::string> *)local_170,(char (*) [6])"ERROR");
    std::operator+(&local_c0,"Received input : ",&local_120);
    (*peVar1->_vptr_PSLogger[2])(peVar1,2,local_a0,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_120);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_170);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::InputType>_>_>
    ::~_Rb_tree(&local_60);
    std::__cxx11::string::~string(local_a0);
  }
  this->m_last_input = p_input;
  if (p_input - Up < 5) {
    local_130 = (this->m_current_level).cells.
                super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
                super__Vector_impl_data._M_finish;
    pCVar3 = (this->m_current_level).cells.
             super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_140 = this;
    local_138 = __return_storage_ptr__;
    while (__return_storage_ptr__ = local_138, pCVar3 != local_130) {
      local_128 = pCVar3;
      for (p_Var4 = (pCVar3->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(pCVar3->objects)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        std::__shared_ptr<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2> *)local_170,
                   &(this->m_compiled_game).player_object);
        cVar2 = (**(code **)(*(long *)local_170._0_8_ + 0x38))(local_170._0_8_,p_Var4 + 1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 8));
        if (cVar2 != '\0') {
          *(InputType *)&p_Var4[1]._M_left = p_input;
        }
      }
      pCVar3 = local_128 + 1;
    }
    next_turn(local_138,local_140);
  }
  else {
    if ((int)(this->m_config).log_verbosity < 5) {
      peVar1 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string(local_e0,(string *)&m_engine_log_cat_abi_cxx11_);
      std::__cxx11::string::string<std::allocator<char>>
                (local_100,"invalid input type.",(allocator<char> *)local_170);
      (*peVar1->_vptr_PSLogger[2])(peVar1,4,local_e0,local_100);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_e0);
      if ((this->m_config).log_operation_history_after_error == true) {
        print_operation_history(this);
      }
    }
    (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>)._M_payload.
    super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
    super__Optional_payload_base<PSEngine::TurnHistory>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

optional<PSEngine::TurnHistory> PSEngine::receive_input(InputType p_input)
{
    m_operation_history.push_back(Operation(OperationType::Input,p_input));

    PS_LOG("Received input : " + enum_to_str(p_input,to_input_type).value_or("ERROR"));

    m_last_input = p_input;

    ObjectMoveType move_type = ObjectMoveType::None;
    switch (p_input)
    {
    case InputType::Up:
        move_type = ObjectMoveType::Up;
        break;
    case InputType::Down:
        move_type = ObjectMoveType::Down;
        break;
    case InputType::Left:
        move_type = ObjectMoveType::Left;
        break;
    case InputType::Right:
        move_type = ObjectMoveType::Right;
        break;
    case InputType::Action:
        move_type = ObjectMoveType::Action;
        break;
    default:
        PS_LOG_ERROR("invalid input type.");
        return nullopt;
    }

    //marking player with input
    for(Cell& cell : m_current_level.cells)
    {
        for(auto& pair :cell.objects)
        {
            if(m_compiled_game.player_object.lock()->defines(pair.first))
            {
                pair.second = move_type;
            }
        }
    }

    return next_turn();
}